

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O2

ImGuiWindowFlags_ __thiscall ACIWnd::beforeBegin(ACIWnd *this)

{
  bool bVar1;
  ImGuiStyle *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  
  if (NAN(ACI_LABEL_SIZE)) {
    ImGui::SetWindowFontScale(1.0);
    IVar4 = ImGui::CalcTextSize("___Heading | Pitch | Roll_",(char *)0x0,false,-1.0);
    fVar3 = ceilf(IVar4.x / 10.0);
    ACI_LABEL_SIZE = fVar3 * 10.0;
    IVar4 = ImGui::CalcTextSize("_____AUTO",(char *)0x0,false,-1.0);
    fVar3 = ceilf(IVar4.x / 10.0);
    ACI_AUTO_CB_SIZE = fVar3 * 10.0;
  }
  bVar1 = ImgWindow::IsPoppedOut((ImgWindow *)this);
  if (!bVar1) {
    dataRefs.ACIrect = LTImgWindow::GetCurrentWindowGeometry(&this->super_LTImgWindow);
  }
  pIVar2 = ImGui::GetStyle();
  fVar3 = (float)dataRefs.UIopacity;
  pIVar2->Colors[2].x = 0.0;
  pIVar2->Colors[2].y = 0.0;
  pIVar2->Colors[2].z = 0.0;
  pIVar2->Colors[2].w = fVar3 / 100.0;
  return ImGuiWindowFlags_NoSavedSettings;
}

Assistant:

ImGuiWindowFlags_ ACIWnd::beforeBegin()
{
    // If not yet done calculate some common widths
    if (std::isnan(ACI_LABEL_SIZE)) {
        /// Size of longest text plus some room for tree indenttion, rounded up to the next 10
        ImGui::SetWindowFontScale(1.0f);
        ACI_LABEL_SIZE   = std::ceil(ImGui::CalcTextSize("___Heading | Pitch | Roll_").x / 10.0f) * 10.0f;
        ACI_AUTO_CB_SIZE = std::ceil(ImGui::CalcTextSize("_____AUTO").x / 10.0f) * 10.0f;
    }
    
    // Save latest screen size to configuration (if not popped out)
    if (!IsPoppedOut())
        dataRefs.ACIrect = GetCurrentWindowGeometry();
    
    // Set background opacity
    ImGuiStyle& style = ImGui::GetStyle();
    style.Colors[ImGuiCol_WindowBg] =  ImColor(0.0f, 0.0f, 0.0f, float(dataRefs.UIopacity)/100.0f);
    
    // For A/C Info Window we don't store any settings in imgui.ini
    // because we can open multiple windows which all get different random ids, which collect over time
    return ImGuiWindowFlags_NoSavedSettings;
}